

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O0

void k051649_frequency_w(void *chip,UINT8 offset,UINT8 data)

{
  uint *puVar1;
  k051649_sound_channel *chn;
  UINT8 freq_hi;
  k051649_state *info;
  UINT8 data_local;
  UINT8 offset_local;
  void *chip_local;
  
  puVar1 = (uint *)((long)chip + (long)((int)(uint)offset >> 1) * 0x2c + 8);
  if ((*(byte *)((long)chip + 0x100) & 0x20) == 0) {
    if ((int)puVar1[1] < 9) {
      *puVar1 = *puVar1 | 0xffff;
    }
  }
  else {
    *puVar1 = 0xffffffff;
  }
  if ((offset & 1) == 0) {
    puVar1[1] = puVar1[1] & 0xf00 | (uint)data;
  }
  else {
    puVar1[1] = puVar1[1] & 0xff | (data & 0xf) << 8;
  }
  *puVar1 = *puVar1 & 0xffff0000;
  return;
}

Assistant:

static void k051649_frequency_w(void *chip, UINT8 offset, UINT8 data)
{
	k051649_state *info = (k051649_state *)chip;
	UINT8 freq_hi = offset & 1;
	k051649_sound_channel* chn = &info->channel_list[offset >> 1];
	
	// test-register bit 5 resets the internal counter
	if (info->test & 0x20)
		chn->counter = ~0;
	else if (chn->frequency < 9)
		chn->counter |= ((1 << FREQ_BITS) - 1);

	// update frequency
	if (freq_hi)
		chn->frequency = (chn->frequency & 0x0ff) | ((data << 8) & 0xf00);
	else
		chn->frequency = (chn->frequency & 0xf00) | data;
	chn->counter &= 0xFFFF0000;	// Valley Bell: Behaviour according to openMSX
}